

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

void mxx::impl::all2allv_big<std::pair<unsigned_long,unsigned_long>>
               (pair<unsigned_long,_unsigned_long> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs,
               pair<unsigned_long,_unsigned_long> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs,comm *comm)

{
  uint uVar1;
  unsigned_long uVar2;
  MPI_Comm poVar3;
  MPI_Datatype poVar4;
  MPI_Request *ppoVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  datatype dt_1;
  requests reqs;
  datatype dt;
  datatype local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  requests local_90;
  pair<unsigned_long,_unsigned_long> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  pair<unsigned_long,_unsigned_long> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  datatype local_48;
  
  uVar6 = (ulong)((long)(send_sizes->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(send_sizes->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  local_98 = recv_sizes;
  local_70 = msgs;
  local_68 = send_displs;
  local_60 = send_sizes;
  local_58 = out;
  local_50 = recv_displs;
  if (comm->m_size != (int)uVar6) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_90);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)local_90._vptr_requests & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
           ,0x131,"all2allv_big","static_cast<int>(send_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    uVar6 = (ulong)(uint)comm->m_size;
  }
  if ((int)uVar6 !=
      (int)((ulong)((long)(local_98->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(local_98->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_90);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)local_90._vptr_requests & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
           ,0x132,"all2allv_big","static_cast<int>(recv_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    uVar6 = (ulong)(uint)comm->m_size;
  }
  local_90._vptr_requests = (_func_int **)&PTR__requests_00176310;
  local_90.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)uVar6) {
    iVar7 = 0;
    iVar9 = 0;
    do {
      uVar6 = (long)(comm->m_rank + (int)uVar6 + iVar7) % (long)(int)uVar6;
      local_b0.mpitype = datatype_builder<std::pair<unsigned_long,_unsigned_long>_>::get_type();
      local_b0._vptr_datatype = (_func_int **)&PTR__datatype_00176200;
      local_b0.builtin = false;
      iVar8 = (int)uVar6;
      datatype::contiguous
                (&local_48,&local_b0,
                 (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[iVar8]);
      datatype::~datatype(&local_b0);
      poVar4 = local_48.mpitype;
      uVar2 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar8];
      poVar3 = comm->mpi_comm;
      ppoVar5 = requests::add(&local_90);
      MPI_Irecv(local_58 + uVar2,1,poVar4,uVar6 & 0xffffffff,0x3039,poVar3,ppoVar5);
      datatype::~datatype(&local_48);
      iVar9 = iVar9 + 1;
      uVar1 = comm->m_size;
      uVar6 = (ulong)uVar1;
      iVar7 = iVar7 + -1;
    } while (iVar9 < (int)uVar1);
    if (0 < (int)uVar1) {
      iVar7 = 0;
      do {
        uVar6 = (long)(comm->m_rank + iVar7) % (long)(int)uVar6;
        local_b0.mpitype = datatype_builder<std::pair<unsigned_long,_unsigned_long>_>::get_type();
        local_b0._vptr_datatype = (_func_int **)&PTR__datatype_00176200;
        local_b0.builtin = false;
        iVar9 = (int)uVar6;
        datatype::contiguous
                  (&local_48,&local_b0,
                   (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[iVar9]);
        datatype::~datatype(&local_b0);
        poVar4 = local_48.mpitype;
        uVar2 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[iVar9];
        poVar3 = comm->mpi_comm;
        ppoVar5 = requests::add(&local_90);
        MPI_Isend(local_70 + uVar2,1,poVar4,uVar6 & 0xffffffff,0x3039,poVar3,ppoVar5);
        datatype::~datatype(&local_48);
        iVar7 = iVar7 + 1;
        uVar6 = (ulong)(uint)comm->m_size;
      } while (iVar7 < comm->m_size);
    }
  }
  MPI_Waitall((ulong)((long)local_90.m_requests.
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_90.m_requests.
                           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3,
              local_90.m_requests.
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start,0);
  requests::~requests(&local_90);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& send_displs, T* out, const std::vector<size_t>& recv_sizes, const std::vector<size_t>& recv_displs, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}